

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void cpu_address_space_init_sparc64(CPUState *cpu,int asidx,MemoryRegion *mr)

{
  CPUAddressSpace *pCVar1;
  MemoryRegion *mr_local;
  int asidx_local;
  CPUState *cpu_local;
  
  if (asidx < cpu->num_ases) {
    if (cpu->cpu_ases == (CPUAddressSpace *)0x0) {
      pCVar1 = (CPUAddressSpace *)g_malloc0_n((long)cpu->num_ases,0x68);
      cpu->cpu_ases = pCVar1;
      cpu->cpu_ases->cpu = cpu;
      cpu->cpu_ases->as = &cpu->uc->address_space_memory;
      (cpu->cpu_ases->tcg_as_listener).commit = tcg_commit;
      memory_listener_register_sparc64(&cpu->cpu_ases->tcg_as_listener,cpu->cpu_ases->as);
    }
    if (0 < asidx) {
      cpu->cpu_ases[asidx].cpu = cpu;
      cpu->cpu_ases[asidx].as = &cpu->uc->address_space_memory;
      cpu->cpu_ases[asidx].tcg_as_listener.commit = tcg_commit;
      memory_listener_register_sparc64
                (&cpu->cpu_ases[asidx].tcg_as_listener,cpu->cpu_ases[asidx].as);
    }
    return;
  }
  __assert_fail("asidx < cpu->num_ases",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x23a,"void cpu_address_space_init_sparc64(CPUState *, int, MemoryRegion *)");
}

Assistant:

void cpu_address_space_init(CPUState *cpu, int asidx, MemoryRegion *mr)
{
    /* Target code should have set num_ases before calling us */
    assert(asidx < cpu->num_ases);

    if (!cpu->cpu_ases) {
        cpu->cpu_ases = g_new0(CPUAddressSpace, cpu->num_ases);
        cpu->cpu_ases[0].cpu = cpu;
        cpu->cpu_ases[0].as = &(cpu->uc->address_space_memory);
        cpu->cpu_ases[0].tcg_as_listener.commit = tcg_commit;
        memory_listener_register(&(cpu->cpu_ases[0].tcg_as_listener), cpu->cpu_ases[0].as);
    }
    /* arm security memory */
    if (asidx > 0) {
        cpu->cpu_ases[asidx].cpu = cpu;
        cpu->cpu_ases[asidx].as = &(cpu->uc->address_space_memory);
        cpu->cpu_ases[asidx].tcg_as_listener.commit = tcg_commit;
        memory_listener_register(&(cpu->cpu_ases[asidx].tcg_as_listener), cpu->cpu_ases[asidx].as);
    }
}